

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_pipeline_int8_x86
          (ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  long *plVar5;
  ulong uVar6;
  int iVar7;
  bool *pbVar8;
  byte *in_RSI;
  Option *in_RDI;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_00000710;
  ConvolutionDepthWise_x86_fma *in_stack_00000718;
  int in_stack_fffffffffffffef4;
  Mat *in_stack_fffffffffffffef8;
  Mat *in_stack_ffffffffffffff00;
  int *local_f8;
  long *local_e0;
  Allocator *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  int iVar9;
  
  uVar6 = (long)*(int *)((long)&in_RDI[4].num_threads + *(long *)(*(long *)in_RDI + -0x18)) /
          (long)*(int *)((long)&in_RDI[4].blob_allocator + *(long *)(*(long *)in_RDI + -0x18));
  iVar7 = ((int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                (long)(*(int *)((long)&in_RDI[3].workspace_allocator +
                               *(long *)(*(long *)in_RDI + -0x18) + 4) *
                      *(int *)((long)&in_RDI[3].openmp_blocktime +
                              *(long *)(*(long *)in_RDI + -0x18)))) /
          (*(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)) /
          *(int *)((long)&in_RDI[4].blob_allocator + *(long *)(*(long *)in_RDI + -0x18)))) *
          *(int *)((long)&in_RDI[4].blob_allocator + *(long *)(*(long *)in_RDI + -0x18));
  if ((iVar7 == *(int *)((long)&in_RDI[4].blob_allocator + *(long *)(*(long *)in_RDI + -0x18))) &&
     (*(int *)((long)&in_RDI[4].blob_allocator + *(long *)(*(long *)in_RDI + -0x18)) ==
      *(int *)((long)&in_RDI[3].workspace_allocator + *(long *)(*(long *)in_RDI + -0x18)))) {
    iVar9 = 1;
    if (((in_RSI[0x27] & 1) != 0) && (iVar9 = 1, iVar7 % 8 == 0)) {
      iVar9 = 8;
    }
    if (iVar9 == 8) {
      Mat::reshape((Mat *)CONCAT44(8,in_stack_ffffffffffffff48),in_stack_ffffffffffffff44,
                   in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      convert_packing(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                      in_RDI);
      if (local_f8 != (int *)0x0) {
        LOCK();
        iVar7 = *local_f8;
        *local_f8 = *local_f8 + -1;
        UNLOCK();
        if (iVar7 == 1) {
          if (local_e0 == (long *)0x0) {
            if (in_stack_ffffffffffffff00 != (Mat *)0x0) {
              free(in_stack_ffffffffffffff00);
            }
          }
          else {
            (**(code **)(*local_e0 + 0x18))(local_e0,in_stack_ffffffffffffff00);
          }
        }
      }
    }
    if (iVar9 == 1) {
      lVar1 = *(long *)(*(long *)in_RDI + -0x18);
      pbVar8 = &in_RDI->use_shader_pack8;
      if (pbVar8 != &in_RDI[5].use_shader_pack8 + lVar1) {
        if (*(long *)((long)&in_RDI[5].flush_denormals + lVar1) != 0) {
          piVar2 = *(int **)((long)&in_RDI[5].flush_denormals + lVar1);
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        lVar3._0_4_ = in_RDI->flush_denormals;
        lVar3._4_1_ = in_RDI->use_local_pool_allocator;
        lVar3._5_1_ = in_RDI->use_shader_local_memory;
        lVar3._6_1_ = in_RDI->use_cooperative_matrix;
        lVar3._7_1_ = in_RDI->use_winograd23_convolution;
        if (lVar3 != 0) {
          piVar2 = *(int **)&in_RDI->flush_denormals;
          LOCK();
          iVar7 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar7 == 1) {
            if (in_RDI[1].blob_allocator == (Allocator *)0x0) {
              if (*(void **)pbVar8 != (void *)0x0) {
                free(*(void **)pbVar8);
              }
            }
            else {
              uVar4._0_1_ = in_RDI->use_shader_pack8;
              uVar4._1_1_ = in_RDI->use_subgroup_basic;
              uVar4._2_1_ = in_RDI->use_subgroup_vote;
              uVar4._3_1_ = in_RDI->use_subgroup_ballot;
              uVar4._4_1_ = in_RDI->use_subgroup_shuffle;
              uVar4._5_1_ = in_RDI->use_image_storage;
              uVar4._6_1_ = in_RDI->use_tensor_storage;
              uVar4._7_1_ = in_RDI->use_reserved_0;
              (*(in_RDI[1].blob_allocator)->_vptr_Allocator[3])(in_RDI[1].blob_allocator,uVar4);
            }
          }
        }
        in_RDI->use_shader_pack8 = false;
        in_RDI->use_subgroup_basic = false;
        in_RDI->use_subgroup_vote = false;
        in_RDI->use_subgroup_ballot = false;
        in_RDI->use_subgroup_shuffle = false;
        in_RDI->use_image_storage = false;
        in_RDI->use_tensor_storage = false;
        in_RDI->use_reserved_0 = false;
        in_RDI->use_winograd43_convolution = false;
        in_RDI->use_winograd63_convolution = false;
        in_RDI->use_reserved_6 = false;
        in_RDI->use_reserved_7 = false;
        in_RDI->use_reserved_8 = false;
        in_RDI->use_reserved_9 = false;
        in_RDI->use_reserved_10 = false;
        in_RDI->use_reserved_11 = false;
        *(undefined4 *)(in_RDI + 1) = 0;
        *(undefined4 *)&in_RDI[1].workspace_allocator = 0;
        *(undefined4 *)((long)&in_RDI[1].workspace_allocator + 4) = 0;
        in_RDI[1].openmp_blocktime = 0;
        in_RDI[1].use_winograd_convolution = false;
        in_RDI[1].use_sgemm_convolution = false;
        in_RDI[1].use_int8_inference = false;
        in_RDI[1].use_vulkan_compute = false;
        in_RDI[1].use_bf16_storage = false;
        in_RDI[1].use_fp16_packed = false;
        in_RDI[1].use_fp16_storage = false;
        in_RDI[1].use_fp16_arithmetic = false;
        in_RDI[1].use_shader_pack8 = false;
        in_RDI[1].use_subgroup_basic = false;
        in_RDI[1].use_subgroup_vote = false;
        in_RDI[1].use_subgroup_ballot = false;
        in_RDI[1].use_subgroup_shuffle = false;
        in_RDI[1].use_image_storage = false;
        in_RDI[1].use_tensor_storage = false;
        in_RDI[1].use_reserved_0 = false;
        in_RDI->flush_denormals = 0;
        in_RDI->use_local_pool_allocator = false;
        in_RDI->use_shader_local_memory = false;
        in_RDI->use_cooperative_matrix = false;
        in_RDI->use_winograd23_convolution = false;
        *(undefined8 *)pbVar8 = *(undefined8 *)(&in_RDI[5].use_shader_pack8 + lVar1);
        uVar4 = *(undefined8 *)((long)&in_RDI[5].flush_denormals + lVar1);
        in_RDI->flush_denormals = (int)uVar4;
        in_RDI->use_local_pool_allocator = (bool)(char)((ulong)uVar4 >> 0x20);
        in_RDI->use_shader_local_memory = (bool)(char)((ulong)uVar4 >> 0x28);
        in_RDI->use_cooperative_matrix = (bool)(char)((ulong)uVar4 >> 0x30);
        in_RDI->use_winograd23_convolution = (bool)(char)((ulong)uVar4 >> 0x38);
        *(undefined8 *)&in_RDI->use_winograd43_convolution =
             *(undefined8 *)(&in_RDI[5].use_winograd43_convolution + lVar1);
        *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(&in_RDI[6].lightmode + lVar1);
        in_RDI[1].blob_allocator = *(Allocator **)((long)&in_RDI[6].blob_allocator + lVar1);
        *(undefined4 *)&in_RDI[1].workspace_allocator =
             *(undefined4 *)((long)&in_RDI[6].workspace_allocator + lVar1);
        *(undefined4 *)((long)&in_RDI[1].workspace_allocator + 4) =
             *(undefined4 *)((long)&in_RDI[6].workspace_allocator + lVar1 + 4);
        in_RDI[1].openmp_blocktime = *(int *)((long)&in_RDI[6].openmp_blocktime + lVar1);
        *(undefined4 *)&in_RDI[1].use_winograd_convolution =
             *(undefined4 *)(&in_RDI[6].use_winograd_convolution + lVar1);
        *(undefined4 *)&in_RDI[1].use_bf16_storage =
             *(undefined4 *)(&in_RDI[6].use_bf16_storage + lVar1);
        *(undefined8 *)&in_RDI[1].use_shader_pack8 =
             *(undefined8 *)(&in_RDI[6].use_shader_pack8 + lVar1);
      }
    }
  }
  else {
    create_group_ops(in_stack_00000718,in_stack_00000710);
    if ((*in_RSI & 1) != 0) {
      lVar1 = *(long *)(*(long *)in_RDI + -0x18);
      pbVar8 = &in_RDI[5].use_shader_pack8 + lVar1;
      if (*(long *)((long)&in_RDI[5].flush_denormals + lVar1) != 0) {
        piVar2 = *(int **)((long)&in_RDI[5].flush_denormals + lVar1);
        LOCK();
        iVar7 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar7 == 1) {
          if (*(long *)((long)&in_RDI[6].blob_allocator + lVar1) == 0) {
            if (*(void **)pbVar8 != (void *)0x0) {
              free(*(void **)pbVar8);
            }
          }
          else {
            plVar5 = *(long **)((long)&in_RDI[6].blob_allocator + lVar1);
            (**(code **)(*plVar5 + 0x18))(plVar5,*(undefined8 *)pbVar8);
          }
        }
      }
      *(undefined8 *)pbVar8 = 0;
      *(undefined8 *)(&in_RDI[5].use_winograd43_convolution + lVar1) = 0;
      *(undefined4 *)(&in_RDI[6].lightmode + lVar1) = 0;
      *(undefined4 *)((long)&in_RDI[6].workspace_allocator + lVar1) = 0;
      *(undefined4 *)((long)&in_RDI[6].workspace_allocator + lVar1 + 4) = 0;
      *(undefined4 *)((long)&in_RDI[6].openmp_blocktime + lVar1) = 0;
      *(undefined4 *)(&in_RDI[6].use_winograd_convolution + lVar1) = 0;
      *(undefined4 *)(&in_RDI[6].use_bf16_storage + lVar1) = 0;
      *(undefined8 *)(&in_RDI[6].use_shader_pack8 + lVar1) = 0;
      *(undefined8 *)((long)&in_RDI[5].flush_denormals + lVar1) = 0;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            elempack = channels % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__

        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }

        if (elempack == 1)
        {
            weight_data_tm = weight_data;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}